

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcSymObjBase::set_mod_base_sym(CTcSymObjBase *this,CTcSymObj *sym)

{
  this->mod_base_sym_ = sym;
  if (sym != (CTcSymObj *)0x0) {
    (sym->super_CTcSymObjBase).modifying_obj_.sym_ = (CTcSymObj *)this;
  }
  return;
}

Assistant:

void CTcSymObjBase::set_mod_base_sym(CTcSymObj *sym)
{
    /* remember the object I'm modifying */
    mod_base_sym_ = sym;

    /* 
     *   set the other object's link back to me, so it knows that I'm the
     *   object that's modifying it 
     */
    if (sym != 0)
        sym->set_modifying_sym((CTcSymObj *)this);
}